

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

void __thiscall Dashel::SocketStream::SocketStream(SocketStream *this,string *targetName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"tcp","");
  Stream::Stream((Stream *)&(this->super_DisconnectableStream).field_0x1038,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"tcp","");
  (this->super_DisconnectableStream).super_SelectableStream.fd = -1;
  (this->super_DisconnectableStream).super_SelectableStream.writeOnly = false;
  (this->super_DisconnectableStream).super_SelectableStream.pollEvent = 1;
  (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream =
       (_func_int **)0x1224d8;
  *(undefined8 *)&(this->super_DisconnectableStream).field_0x1038 = 0x122528;
  (this->super_DisconnectableStream).recvBufferPos = 0;
  (this->super_DisconnectableStream).recvBufferSize = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream =
       (_func_int **)&PTR__SocketStream_00122400;
  *(undefined ***)&(this->super_DisconnectableStream).field_0x1038 = &PTR__SocketStream_00122468;
  ExpandableBuffer::ExpandableBuffer
            ((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020,0x100);
  ParameterSet::add((ParameterSet *)
                    (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                    (long)(this->super_DisconnectableStream).super_SelectableStream.
                          _vptr_SelectableStream[-3]),"tcp:host;port;connectionPort=-1;sock=-1");
  ParameterSet::add((ParameterSet *)
                    (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                    (long)(this->super_DisconnectableStream).super_SelectableStream.
                          _vptr_SelectableStream[-3]),(targetName->_M_dataplus)._M_p);
  iVar2 = getOrCreateSocket((ParameterSet *)
                            (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                            (long)(this->super_DisconnectableStream).super_SelectableStream.
                                  _vptr_SelectableStream[-3]));
  (this->super_DisconnectableStream).super_SelectableStream.fd = iVar2;
  iVar2 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                     (long)(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream[-3]),"sock");
  if (-1 < iVar2) {
    ParameterSet::erase((ParameterSet *)
                        (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                        (long)(this->super_DisconnectableStream).super_SelectableStream.
                              _vptr_SelectableStream[-3]),"sock");
  }
  return;
}

Assistant:

explicit SocketStream(const string& targetName) :
			Stream("tcp"),
			DisconnectableStream("tcp")
#ifndef TCP_CORK
			,
			sendBuffer(SEND_BUFFER_SIZE_INITIAL)
#endif
		{
			target.add("tcp:host;port;connectionPort=-1;sock=-1");
			target.add(targetName.c_str());

			fd = getOrCreateSocket(target);
			if (target.get<int>("sock") >= 0)
			{
				// remove file descriptor information from target name
				target.erase("sock");
			}

#ifdef TCP_CORK
			// setup TCP Cork for delayed sending
			int flag = 1;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
#endif
		}